

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::XMLReader::containsWhiteSpace(XMLReader *this,XMLCh *toCheck,XMLSize_t count)

{
  XMLCh *pXVar1;
  XMLCh *curCh;
  XMLCh *pXVar2;
  
  pXVar1 = toCheck;
  do {
    pXVar2 = pXVar1;
    if (toCheck + count <= pXVar2) break;
    pXVar1 = pXVar2 + 1;
  } while (-1 < (char)this->fgCharCharsTable[(ushort)*pXVar2]);
  return pXVar2 < toCheck + count;
}

Assistant:

bool XMLReader::containsWhiteSpace(const   XMLCh* const    toCheck
                            , const XMLSize_t     count) const
{
    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;
    while (curCh < endPtr)
    {
        if (fgCharCharsTable[*curCh++] & gWhitespaceCharMask)
            return true;
    }
    return false;
}